

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
fasttext::FastText::getAnalogies(FastText *this,int32_t k,string *wordA,string *wordB,string *wordC)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  ulong uVar1;
  int32_t k_00;
  bool bVar2;
  type __comp;
  string *in_RCX;
  undefined4 in_EDX;
  FastText *in_RDI;
  string *this_00;
  string *in_R8;
  string *in_R9;
  real rVar3;
  real rVar4;
  real rVar5;
  Vector buffer;
  Vector query;
  int64_t in_stack_fffffffffffffe68;
  Vector *in_stack_fffffffffffffe70;
  Vector *in_stack_fffffffffffffe80;
  Vector *in_stack_fffffffffffffe90;
  Vector *in_stack_fffffffffffffe98;
  string *psVar6;
  FastText *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  FastText *this_01;
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [24];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff58;
  string local_a0 [4];
  Vector *query_00;
  DenseMatrix *in_stack_ffffffffffffff70;
  FastText *in_stack_ffffffffffffff78;
  
  this_01 = in_RDI;
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1bcc05);
  Vector::Vector(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  Vector::zero(in_stack_fffffffffffffe80);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1bcc3a);
  Vector::Vector(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  getWordVector(this_01,(Vector *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                (string *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  rVar3 = Vector::norm(in_stack_fffffffffffffe90);
  Vector::addVector((Vector *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                    (real)((ulong)in_stack_fffffffffffffe90 >> 0x20));
  getWordVector(this_01,(Vector *)CONCAT44(rVar3,in_stack_fffffffffffffec8),
                (string *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  rVar4 = Vector::norm(in_stack_fffffffffffffe90);
  Vector::addVector((Vector *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                    (real)((ulong)in_stack_fffffffffffffe90 >> 0x20));
  getWordVector(this_01,(Vector *)CONCAT44(rVar3,rVar4),
                (string *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  rVar5 = Vector::norm(in_stack_fffffffffffffe90);
  Vector::addVector((Vector *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                    (real)((ulong)in_stack_fffffffffffffe90 >> 0x20));
  lazyComputeWordVectors(in_stack_fffffffffffffea0);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>
                      *)0x1bcdb4);
  if (!bVar2) {
    __assert_fail("wordVectors_",
                  "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/fasttext.cc"
                  ,0x270,
                  "std::vector<std::pair<real, std::string>> fasttext::FastText::getAnalogies(int32_t, const std::string &, const std::string &, const std::string &)"
                 );
  }
  __comp = std::unique_ptr<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>::
           operator*((unique_ptr<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>
                      *)in_stack_fffffffffffffe70);
  std::__cxx11::string::string(local_100,in_RCX);
  std::__cxx11::string::string(local_e0,in_R8);
  std::__cxx11::string::string(local_c0,in_R9);
  _local_a0 = local_100;
  query_00 = (Vector *)0x3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x1bceb8);
  __l._M_array._4_4_ = rVar3;
  __l._M_array._0_4_ = rVar4;
  __l._M_len = (size_type)this_01;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)CONCAT44(rVar5,in_stack_fffffffffffffec0),__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        __comp,(allocator_type *)CONCAT44(in_EDX,in_stack_fffffffffffffeb0));
  psVar6 = _local_a0;
  uVar1 = (ulong)_local_a0 >> 0x20;
  k_00 = (int32_t)uVar1;
  _local_a0 = psVar6;
  getNN(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,query_00,k_00,in_stack_ffffffffffffff58)
  ;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x1bcf1c);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x1bcf29);
  psVar6 = local_100;
  this_00 = local_a0;
  do {
    this_00 = this_00 + -0x20;
    std::__cxx11::string::~string(this_00);
  } while (this_00 != psVar6);
  Vector::~Vector((Vector *)0x1bcf73);
  Vector::~Vector((Vector *)0x1bcf80);
  return (vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)in_RDI;
}

Assistant:

std::vector<std::pair<real, std::string>> FastText::getAnalogies(
    int32_t k,
    const std::string& wordA,
    const std::string& wordB,
    const std::string& wordC) {
  Vector query(args_->dim);
  query.zero();

  Vector buffer(args_->dim);
  getWordVector(buffer, wordA);
  query.addVector(buffer, 1.0 / (buffer.norm() + 1e-8));
  getWordVector(buffer, wordB);
  query.addVector(buffer, -1.0 / (buffer.norm() + 1e-8));
  getWordVector(buffer, wordC);
  query.addVector(buffer, 1.0 / (buffer.norm() + 1e-8));

  lazyComputeWordVectors();
  assert(wordVectors_);
  return getNN(*wordVectors_, query, k, {wordA, wordB, wordC});
}